

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.h
# Opt level: O1

void cvarfunc_fluid_interp(FIntCVar *self)

{
  int iVar1;
  UCVarValue value;
  
  iVar1 = self->Value;
  if (iVar1 < 0) {
    value.String = (char *)0x0;
  }
  else {
    switch(iVar1) {
    case 2:
      value = (UCVarValue)0x1;
      break;
    case 3:
    case 5:
      value = (UCVarValue)0x4;
      break;
    default:
      if (iVar1 < 8) {
        if (currSong != (MusInfo *)0x0) {
          (*currSong->_vptr_MusInfo[0x11])(currSong,"synth.interpolation");
          return;
        }
        return;
      }
    case 6:
      value = (UCVarValue)0x7;
    }
  }
  FBaseCVar::SetGenericRep(&self->super_FBaseCVar,value,CVAR_Int);
  return;
}

Assistant:

inline operator int () const { return Value; }